

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::UseObjectLibraries
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objs,string *config)

{
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *__k;
  pointer ppcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *tgt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  string objLib;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_b8;
  string *local_98;
  cmGeneratorTarget **local_90;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_88;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_68;
  string local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = config;
  GetExternalObjects(this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &local_68,config);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (cmGeneratorTarget **)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppcVar1 = local_68._M_impl.super__Vector_impl_data._M_start;
      ppcVar1 != local_68._M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_50,*ppcVar1);
    local_b8._M_impl.super__Vector_impl_data._M_start =
         (pointer)cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,&local_50);
    if ((cmGeneratorTarget *)local_b8._M_impl.super__Vector_impl_data._M_start !=
        (cmGeneratorTarget *)0x0) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_88,
                 (value_type *)&local_b8);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_90 = (cmGeneratorTarget **)
             cmRemoveDuplicates<std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                       ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                        &local_88);
  for (ppcVar2 = local_88._M_impl.super__Vector_impl_data._M_start; ppcVar2 != local_90;
      ppcVar2 = ppcVar2 + 1) {
    this_00 = *ppcVar2;
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetObjectSources(this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                             &local_b8,local_98);
    for (__k = (cmGeneratorTarget *)local_b8._M_impl.super__Vector_impl_data._M_start;
        __k != (cmGeneratorTarget *)local_b8._M_impl.super__Vector_impl_data._M_finish;
        __k = (cmGeneratorTarget *)&__k->Makefile) {
      std::__cxx11::string::string((string *)&local_50,(string *)&this_00->ObjectDirectory);
      std::
      map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this_00->Objects,(key_type *)__k);
      std::__cxx11::string::append((string *)&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(objs,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&local_b8);
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&local_88);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void
cmGeneratorTarget::UseObjectLibraries(std::vector<std::string>& objs,
                                      const std::string &config) const
{
  std::vector<cmSourceFile const*> objectFiles;
  this->GetExternalObjects(objectFiles, config);
  std::vector<cmGeneratorTarget*> objectLibraries;
  for(std::vector<cmSourceFile const*>::const_iterator
      it = objectFiles.begin(); it != objectFiles.end(); ++it)
    {
    std::string objLib = (*it)->GetObjectLibrary();
    if (cmGeneratorTarget* tgt =
        this->LocalGenerator->FindGeneratorTargetToUse(objLib))
      {
      objectLibraries.push_back(tgt);
      }
    }

  std::vector<cmGeneratorTarget*>::const_iterator end
      = cmRemoveDuplicates(objectLibraries);

  for(std::vector<cmGeneratorTarget*>::const_iterator
        ti = objectLibraries.begin();
      ti != end; ++ti)
    {
    cmGeneratorTarget* ogt = *ti;
    std::vector<cmSourceFile const*> objectSources;
    ogt->GetObjectSources(objectSources, config);
    for(std::vector<cmSourceFile const*>::const_iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      std::string obj = ogt->ObjectDirectory;
      obj += ogt->Objects[*si];
      objs.push_back(obj);
      }
    }
}